

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

int FE_Delete_Previous(FORM *form)

{
  int iVar1;
  FIELD *pFVar2;
  char *pcVar3;
  int iVar4;
  char *buf;
  char *pos;
  char *pcVar5;
  char *this_end;
  char *prev_end;
  char *prev_line;
  char *this_line;
  FIELD *field;
  FORM *form_local;
  
  pFVar2 = form->current;
  if ((form->currow == 0) && (form->curcol == 0)) {
    return -0xc;
  }
  iVar4 = form->curcol + -1;
  form->curcol = iVar4;
  if (iVar4 < 0) {
    form->curcol = form->curcol + 1;
    if ((form->status & 4) != 0) {
      return -0xc;
    }
    pcVar3 = pFVar2->buf;
    iVar4 = form->currow;
    iVar1 = pFVar2->dcols;
    buf = pFVar2->buf + form->currow * pFVar2->dcols;
    Synchronize_Buffer(form);
    pos = After_End_Of_Data(pcVar3 + (iVar4 + -1) * iVar1,pFVar2->dcols);
    pcVar5 = After_End_Of_Data(buf,pFVar2->dcols);
    if ((int)pFVar2->cols - ((int)pos - (int)(pcVar3 + (iVar4 + -1) * iVar1)) <
        (int)pcVar5 - (int)buf) {
      return -0xc;
    }
    winsdelln(form->w,0xffffffff);
    Adjust_Cursor_Position(form,pos);
    wmove(form->w,form->currow,form->curcol);
    waddnstr(form->w,buf,(int)pcVar5 - (int)buf);
  }
  else {
    wmove(form->w,form->currow,form->curcol);
    wdelch(form->w);
  }
  return 0;
}

Assistant:

static int FE_Delete_Previous(FORM * form)
{
  FIELD  *field = form->current;
  
  if (First_Position_In_Current_Field(form))
    return E_REQUEST_DENIED;

  if ( (--(form->curcol))<0 )
    {
      char *this_line, *prev_line, *prev_end, *this_end;
      
      form->curcol++;
      if (form->status & _OVLMODE) 
        return E_REQUEST_DENIED;
      
      prev_line = Address_Of_Row_In_Buffer(field,(form->currow-1));
      this_line = Address_Of_Row_In_Buffer(field,(form->currow));
      Synchronize_Buffer(form);
      prev_end = After_End_Of_Data(prev_line,field->dcols);
      this_end = After_End_Of_Data(this_line,field->dcols);
      if ((int)(this_end-this_line) > 
          (field->cols-(int)(prev_end-prev_line))) 
        return E_REQUEST_DENIED;
      wdeleteln(form->w);
      Adjust_Cursor_Position(form,prev_end);
      wmove(form->w,form->currow,form->curcol);
      waddnstr(form->w,this_line,(int)(this_end-this_line));
    } 
  else 
    {
      wmove(form->w,form->currow,form->curcol);
      wdelch(form->w);
    }
  return E_OK;
}